

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O3

void __thiscall
duckdb_shell::ModeTableRenderer::RenderHeader(ModeTableRenderer *this,ColumnarResult *result)

{
  char *str;
  ulong nArg;
  idx_t i;
  
  ShellState::PrintRowSeparator
            ((this->super_ColumnRenderer).super_ShellRenderer.state,result->column_count,"+",
             &result->column_width);
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,"| ");
  if (result->column_count == 0) {
    nArg = 0;
  }
  else {
    i = 0;
    do {
      ColumnRenderer::RenderAlignedValue(&this->super_ColumnRenderer,result,i);
      str = " | ";
      if (i == result->column_count - 1) {
        str = " |\n";
      }
      ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,str);
      i = i + 1;
      nArg = result->column_count;
    } while (i < nArg);
  }
  ShellState::PrintRowSeparator
            ((this->super_ColumnRenderer).super_ShellRenderer.state,nArg,"+",&result->column_width);
  return;
}

Assistant:

void RenderHeader(ColumnarResult &result) override {
		state.PrintRowSeparator(result.column_count, "+", result.column_width);
		state.Print("| ");
		for (idx_t i = 0; i < result.column_count; i++) {
			RenderAlignedValue(result, i);
			state.Print(i == result.column_count - 1 ? " |\n" : " | ");
		}
		state.PrintRowSeparator(result.column_count, "+", result.column_width);
	}